

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseMaps.cpp
# Opt level: O3

bool __thiscall
tonk::ConnectionIdMap::InsertAndAssignId(ConnectionIdMap *this,id_t *idOut,IConnection *connection)

{
  int iVar1;
  uint uVar2;
  insert_result iVar3;
  id_t iVar4;
  bool bVar5;
  id_t *k;
  IConnection *local_40;
  id_t *local_38;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->IdLock);
  if (iVar1 != 0) {
    std::__throw_system_error(iVar1);
  }
  if (this->BestUnusedCount == 0) {
    if ((this->IdMap).TheMap.m_num_valid < 0x1000000) {
      k = &this->NextId;
      local_38 = idOut;
      do {
        iVar4 = *k + 1;
        if (*k - 0xffffff < 0xff000100) {
          iVar4 = 0x100;
        }
        *k = iVar4;
        local_40 = connection;
        iVar3 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
                          (&(this->IdMap).TheMap,k,&local_40);
      } while (((ulong)iVar3 & 0x100000000) == 0);
      bVar5 = true;
      *local_38 = *k;
      goto LAB_00149832;
    }
  }
  else {
    uVar2 = this->BestUnusedCount - 1;
    this->BestUnusedCount = uVar2;
    *idOut = (uint)this->BestUnusedIds[uVar2];
    local_40 = connection;
    iVar3 = LightHashMap<unsigned_int,_tonk::IConnection_*,_tonk::UInt32Hasher>::insert
                      (&(this->IdMap).TheMap,idOut,&local_40);
    bVar5 = true;
    if (((ulong)iVar3 >> 0x20 & 1) != 0) goto LAB_00149832;
    this->BestUnusedCount = this->BestUnusedCount + 1;
  }
  bVar5 = false;
LAB_00149832:
  pthread_mutex_unlock((pthread_mutex_t *)&this->IdLock);
  return bVar5;
}

Assistant:

bool ConnectionIdMap::InsertAndAssignId(
    id_t& idOut,
    IConnection* connection)
{
    Locker locker(IdLock);

    if (BestUnusedCount > 0)
    {
        idOut = BestUnusedIds[--BestUnusedCount];
        const bool success = IdMap.Insert(idOut, connection);
        if (!success) {
            ++BestUnusedCount;
        }
        //ModuleLogger.Trace("ID ADD ", idOut, " + ", connection, " - ", success);
        return success;
    }

    if (IdMap.GetCount() >= protocol::kConnectionIdCount)
    {
        TONK_DEBUG_BREAK(); // Should never happen
        return false;
    }

    // Find next unused Id
    do
    {
        ++NextId;
        if (NextId < 256 || NextId >= protocol::kConnectionIdCount) {
            NextId = 256;
        }
    } while (!IdMap.Insert(NextId, connection));

    idOut = NextId;
    return true;
}